

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

Diagnostics * __thiscall slang::DiagnosticEngine::setMappingsFromPragmas(DiagnosticEngine *this)

{
  Diagnostics *in_RDI;
  anon_class_16_2_f7aba355 *in_stack_00000018;
  SourceManager *in_stack_00000020;
  Diagnostics *diags;
  
  Diagnostics::Diagnostics((Diagnostics *)0x8237bf);
  SourceManager::visitDiagnosticDirectives<slang::DiagnosticEngine::setMappingsFromPragmas()::__0>
            (in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

Diagnostics DiagnosticEngine::setMappingsFromPragmas() {
    Diagnostics diags;
    sourceManager.visitDiagnosticDirectives([&](BufferID buffer, auto& directives) {
        setMappingsFromPragmasImpl<SourceManager::DiagnosticDirectiveInfo>(buffer, directives,
                                                                           diags);
    });

    return diags;
}